

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool cmDependsFortran::CopyModule
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  string_view sVar1;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  ulong uVar5;
  ostream *poVar6;
  Status local_134;
  undefined4 local_12c;
  Status local_128;
  string local_120;
  undefined1 local_100 [8];
  string mod_lower;
  string mod_upper;
  string mod_dir;
  undefined1 local_60 [8];
  string compilerId;
  string *stamp;
  string mod;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  mod.field_2._8_8_ = args;
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,2);
  std::__cxx11::string::string((string *)&stamp,(string *)pvVar3);
  compilerId.field_2._8_8_ =
       (size_type)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator[](mod.field_2._8_8_,3);
  std::__cxx11::string::string((string *)local_60);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)mod.field_2._8_8_);
  if (4 < sVar4) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)mod.field_2._8_8_,4);
    std::__cxx11::string::operator=((string *)local_60,(string *)pvVar3);
  }
  sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&stamp);
  bVar2 = cmHasLiteralSuffix<5ul>(sVar1,(char (*) [5])".mod");
  if (!bVar2) {
    sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&stamp);
    bVar2 = cmHasLiteralSuffix<6ul>(sVar1,(char (*) [6])".smod");
    if (!bVar2) {
      sVar1 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&stamp);
      bVar2 = cmHasLiteralSuffix<5ul>(sVar1,(char (*) [5])".sub");
      if (!bVar2) {
        std::__cxx11::string::operator+=((string *)&stamp,".mod");
      }
    }
  }
  cmsys::SystemTools::GetFilenamePath((string *)((long)&mod_upper.field_2 + 8),(string *)&stamp);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)(mod_upper.field_2._M_local_buf + 8),"/");
  }
  std::__cxx11::string::string
            ((string *)(mod_lower.field_2._M_local_buf + 8),
             (string *)(mod_upper.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_100,(string *)(mod_upper.field_2._M_local_buf + 8));
  cmsys::SystemTools::GetFilenameName(&local_120,(string *)&stamp);
  cmFortranModuleAppendUpperLower
            (&local_120,(string *)((long)&mod_lower.field_2 + 8),(string *)local_100);
  std::__cxx11::string::~string((string *)&local_120);
  bVar2 = cmsys::SystemTools::FileExists((string *)((long)&mod_lower.field_2 + 8),true);
  if (bVar2) {
    bVar2 = ModulesDiffer((string *)((long)&mod_lower.field_2 + 8),
                          (string *)compilerId.field_2._8_8_,(string *)local_60);
    if (bVar2) {
      local_128 = cmsys::SystemTools::CopyFileAlways
                            ((string *)((long)&mod_lower.field_2 + 8),
                             (string *)compilerId.field_2._8_8_);
      bVar2 = cmsys::Status::operator_cast_to_bool(&local_128);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error copying Fortran module from \"");
        poVar6 = std::operator<<(poVar6,(string *)(mod_lower.field_2._M_local_buf + 8));
        poVar6 = std::operator<<(poVar6,"\" to \"");
        poVar6 = std::operator<<(poVar6,(string *)compilerId.field_2._8_8_);
        std::operator<<(poVar6,"\".\n");
        args_local._7_1_ = false;
        goto LAB_0089498b;
      }
    }
    args_local._7_1_ = true;
  }
  else {
    bVar2 = cmsys::SystemTools::FileExists((string *)local_100,true);
    if (bVar2) {
      bVar2 = ModulesDiffer((string *)local_100,(string *)compilerId.field_2._8_8_,
                            (string *)local_60);
      if (bVar2) {
        local_134 = cmsys::SystemTools::CopyFileAlways
                              ((string *)local_100,(string *)compilerId.field_2._8_8_);
        bVar2 = cmsys::Status::operator_cast_to_bool(&local_134);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Error copying Fortran module from \"");
          poVar6 = std::operator<<(poVar6,(string *)local_100);
          poVar6 = std::operator<<(poVar6,"\" to \"");
          poVar6 = std::operator<<(poVar6,(string *)compilerId.field_2._8_8_);
          std::operator<<(poVar6,"\".\n");
          args_local._7_1_ = false;
          goto LAB_0089498b;
        }
      }
      args_local._7_1_ = true;
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Error copying Fortran module \"");
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)mod.field_2._8_8_,2);
      poVar6 = std::operator<<(poVar6,(string *)pvVar3);
      poVar6 = std::operator<<(poVar6,"\".  Tried \"");
      poVar6 = std::operator<<(poVar6,(string *)(mod_lower.field_2._M_local_buf + 8));
      poVar6 = std::operator<<(poVar6,"\" and \"");
      poVar6 = std::operator<<(poVar6,(string *)local_100);
      std::operator<<(poVar6,"\".\n");
      args_local._7_1_ = false;
    }
  }
LAB_0089498b:
  local_12c = 1;
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)(mod_lower.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(mod_upper.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)&stamp);
  return args_local._7_1_;
}

Assistant:

bool cmDependsFortran::CopyModule(const std::vector<std::string>& args)
{
  // Implements
  //
  //   $(CMAKE_COMMAND) -E cmake_copy_f90_mod input.mod output.mod.stamp
  //                                          [compiler-id]
  //
  // Note that the case of the .mod file depends on the compiler.  In
  // the future this copy could also account for the fact that some
  // compilers include a timestamp in the .mod file so it changes even
  // when the interface described in the module does not.

  std::string mod = args[2];
  std::string const& stamp = args[3];
  std::string compilerId;
  if (args.size() >= 5) {
    compilerId = args[4];
  }
  if (!cmHasLiteralSuffix(mod, ".mod") && !cmHasLiteralSuffix(mod, ".smod") &&
      !cmHasLiteralSuffix(mod, ".sub")) {
    // Support depend.make files left by older versions of CMake.
    // They do not include the ".mod" extension.
    mod += ".mod";
  }
  std::string mod_dir = cmSystemTools::GetFilenamePath(mod);
  if (!mod_dir.empty()) {
    mod_dir += "/";
  }
  std::string mod_upper = mod_dir;
  std::string mod_lower = mod_dir;
  cmFortranModuleAppendUpperLower(cmSystemTools::GetFilenameName(mod),
                                  mod_upper, mod_lower);
  if (cmSystemTools::FileExists(mod_upper, true)) {
    if (cmDependsFortran::ModulesDiffer(mod_upper, stamp, compilerId)) {
      if (!cmSystemTools::CopyFileAlways(mod_upper, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_upper
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }
  if (cmSystemTools::FileExists(mod_lower, true)) {
    if (cmDependsFortran::ModulesDiffer(mod_lower, stamp, compilerId)) {
      if (!cmSystemTools::CopyFileAlways(mod_lower, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_lower
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }

  std::cerr << "Error copying Fortran module \"" << args[2] << "\".  Tried \""
            << mod_upper << "\" and \"" << mod_lower << "\".\n";
  return false;
}